

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

History * history_init(void)

{
  int iVar1;
  History *p;
  int n;
  HistEvent_conflict *in_RSI;
  
  p = (History *)malloc(0x60);
  if (p != (History *)0x0) {
    iVar1 = history_def_init((void **)p,in_RSI,n);
    if (iVar1 != -1) {
      p->h_ent = -1;
      p->h_next = history_def_next;
      p->h_first = history_def_first;
      p->h_last = history_def_last;
      p->h_prev = history_def_prev;
      p->h_curr = history_def_curr;
      p->h_set = history_def_set;
      p->h_clear = history_def_clear;
      p->h_enter = history_def_enter;
      p->h_add = history_def_add;
      p->h_del = history_def_del;
      return p;
    }
    free(p);
  }
  return (History *)0x0;
}

Assistant:

TYPE(History) *
FUN(history,init)(void)
{
	TYPE(HistEvent) ev;
	TYPE(History) *h = (TYPE(History) *) h_malloc(sizeof(*h));
	if (h == NULL)
		return NULL;

	if (history_def_init(&h->h_ref, &ev, 0) == -1) {
		h_free(h);
		return NULL;
	}
	h->h_ent = -1;
	h->h_next = history_def_next;
	h->h_first = history_def_first;
	h->h_last = history_def_last;
	h->h_prev = history_def_prev;
	h->h_curr = history_def_curr;
	h->h_set = history_def_set;
	h->h_clear = history_def_clear;
	h->h_enter = history_def_enter;
	h->h_add = history_def_add;
	h->h_del = history_def_del;

	return h;
}